

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::bitselectV128
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Literal local_70;
  Literal local_58;
  Literal local_40;
  Literal *local_28;
  Literal *right_local;
  Literal *left_local;
  Literal *this_local;
  
  local_28 = right;
  right_local = left;
  left_local = this;
  this_local = __return_storage_ptr__;
  andV128(&local_40,this,left);
  notV128(&local_70,this);
  andV128(&local_58,&local_70,local_28);
  orV128(__return_storage_ptr__,&local_40,&local_58);
  ~Literal(&local_58);
  ~Literal(&local_70);
  ~Literal(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitselectV128(const Literal& left,
                               const Literal& right) const {
  return andV128(left).orV128(notV128().andV128(right));
}